

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ExpandAllExtensions
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node)

{
  int *piVar1;
  sp_counted_base *psVar2;
  ostream *poVar3;
  uint uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> JAs;
  string local_78;
  BGIP_BnB_NodePtr local_58;
  BGIP_BnB_NodePtr local_48;
  BGIP_BnB_NodePtr local_38;
  
  if (3 < this->_m_verbosity) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "BGIP_SolverBranchAndBound Expanding the following node: ");
    BGIP_BnB_Node::SoftPrint_abi_cxx11_(&local_78,node->px,&this->_m_jtIndexMapping);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_78);
  }
  local_78.field_2._M_allocated_capacity = 0;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_38.px = node->px;
  local_38.pn.pi_ = (node->pn).pi_;
  psVar2 = (node->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  ComputeValidJointActionExtensions
            (this,&local_38,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
  boost::detail::shared_count::~shared_count(&local_38.pn);
  if (3 < this->_m_verbosity) {
    poVar3 = std::operator<<((ostream *)&std::cout,"BGIP_SolverBranchAndBound found ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," joint action extensions");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  local_48.px = node->px;
  local_48.pn.pi_ = (node->pn).pi_;
  psVar2 = (node->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  Pop(this,&local_48);
  boost::detail::shared_count::~shared_count(&local_48.pn);
  uVar4 = 0;
  while( true ) {
    if ((long)(local_78._M_string_length - (long)local_78._M_dataplus._M_p) >> 2 == (ulong)uVar4)
    break;
    local_58.px = node->px;
    local_58.pn.pi_ = (node->pn).pi_;
    psVar2 = (node->pn).pi_;
    if (psVar2 != (sp_counted_base *)0x0) {
      LOCK();
      piVar1 = &psVar2->use_count_;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    Expand(this,&local_58,*(Index *)(local_78._M_dataplus._M_p + (ulong)uVar4 * 4));
    boost::detail::shared_count::~shared_count(&local_58.pn);
    uVar4 = uVar4 + 1;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
  return;
}

Assistant:

void ExpandAllExtensions(BGIP_BnB_NodePtr node)
    {
        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound Expanding the following node: "
                      << node->SoftPrint(_m_jtIndexMapping) << std::endl;
        // find the valid extensions of this node
        // no by value for std::vectors!
        //std::vector<Index> JAs=
        //ComputeValidJointActionExtensions(node);
        std::vector<Index> JAs;
        ComputeValidJointActionExtensions(node, JAs);
        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound found " << JAs.size()
                      << " joint action extensions" << std::endl;
        
        Pop(node);

        for(Index i=0;i!=JAs.size();++i)
        {
            Expand(node,JAs[i]);
        }

    //    _m_closedQueueIntermediateNodes->push(node);
    }